

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitvector.hpp
# Opt level: O0

pair<unsigned_long,_unsigned_long> __thiscall
bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::subtree_ref_base<true>::find_insert_point
          (subtree_ref_base<true> *this,size_t index)

{
  size_t sVar1;
  word_type wVar2;
  unsigned_long value;
  long in_RSI;
  subtree_ref_base<true> *in_RDI;
  size_t new_index;
  word_type word;
  size_t p;
  size_t step;
  size_t child;
  size_t rem;
  size_t fields_per_word;
  size_t width;
  word_type flag_mask;
  word_type field_mask;
  size_t len;
  size_t in_stack_ffffffffffffff48;
  subtree_ref_base<true> *this_00;
  unsigned_long in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff60 [16];
  const_range_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
  *in_stack_ffffffffffffff70;
  ulong in_stack_ffffffffffffff90;
  ulong uVar3;
  ulong begin;
  subtree_ref_base<true> *local_58;
  subtree_ref_base<true> *local_50;
  subtree_ref_base<true> *local_48;
  size_t local_40;
  word_type local_38;
  word_type local_30;
  subtree_ref_base<true> *local_28;
  long local_20;
  pair<unsigned_long,_unsigned_long> local_10;
  
  local_20 = in_RSI;
  local_28 = (subtree_ref_base<true> *)degree(in_RDI);
  local_30 = packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>
             ::field_mask(&in_RDI->_vector->sizes);
  local_38 = packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>
             ::flag_mask(&in_RDI->_vector->sizes);
  local_40 = in_RDI->_vector->counter_width;
  local_48 = (subtree_ref_base<true> *)
             packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>
             ::elements_per_word((packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>
                                  *)0x13b2e9);
  local_50 = (subtree_ref_base<true> *)((ulong)local_28 % (ulong)local_48);
  ensure_bitsize<unsigned_long,void>(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  local_58 = local_28;
  uVar3 = 0;
  while (begin = uVar3, sVar1 = degree(in_RDI), uVar3 < sVar1) {
    this_00 = local_48;
    if (local_28 < local_48) {
      this_00 = local_50;
    }
    sizes(this_00,begin,in_stack_ffffffffffffff90);
    wVar2 = const_range_reference::operator_cast_to_unsigned_long(in_stack_ffffffffffffff70);
    in_stack_ffffffffffffff90 = wVar2 | local_38;
    value = lowbits<unsigned_long,void>
                      (local_38 & in_stack_ffffffffffffff90 - local_20 * local_30,
                       (long)this_00 * local_40);
    sVar1 = popcount<unsigned_long,void>(value);
    local_58 = (subtree_ref_base<true> *)((long)local_58 - sVar1);
    local_28 = (subtree_ref_base<true> *)((long)local_28 - (long)this_00);
    uVar3 = (long)&this_00->_vector + begin;
  }
  if (local_58 != (subtree_ref_base<true> *)0x0) {
    sizes(in_stack_ffffffffffffff60._0_8_,(size_t)in_RDI);
    const_item_reference::operator_cast_to_unsigned_long
              ((const_item_reference<bv::internal::packed_view<bv::internal::bt_impl<4096UL,_(bv::allocation_policy_t)0>::data_container>_>
                *)0x13b46a);
  }
  std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long_&,_true>
            (&local_10,(unsigned_long *)&local_58,(unsigned_long *)&stack0xffffffffffffff70);
  return local_10;
}

Assistant:

std::pair<size_t, size_t>
            find_insert_point(size_t index) const
            {
                assert(is_node());
                
                using word_type = typename packed_data::word_type;
                
                size_t len = degree();
                const word_type field_mask   = _vector.sizes.field_mask();
                const word_type flag_mask    = _vector.sizes.flag_mask();
                const size_t width           = _vector.counter_width;
                const size_t fields_per_word = _vector.sizes.elements_per_word();
                const size_t rem             = len % fields_per_word;
                
                ensure_bitsize(index, width - 1);
                
                size_t child = len;
                for(size_t step, p = 0; p < degree(); len -= step, p += step)
                {
                    step = len < fields_per_word ? rem : fields_per_word;
                    
                    word_type word = word_type(sizes(p, p + step)) |
                                     flag_mask;
                    
                    child -= popcount(lowbits(flag_mask &
                                              (word - index * field_mask),
                                              step * width));
                }
                
                assert(len == 0);
                
                size_t new_index = index;
                if(child > 0)
                    new_index -= sizes(child - 1);
                
                return { child, new_index };
            }